

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_definition.cpp
# Opt level: O2

void duckdb::InnerGetListOfDependencies
               (ParsedExpression *expr,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *dependencies)

{
  ColumnRefExpression *pCVar1;
  string *__x;
  ColumnRefExpression columnref;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  
  if ((expr->super_BaseExpression).type == COLUMN_REF) {
    pCVar1 = BaseExpression::Cast<duckdb::ColumnRefExpression>(&expr->super_BaseExpression);
    ColumnRefExpression::ColumnRefExpression((ColumnRefExpression *)&local_68,pCVar1);
    __x = ColumnRefExpression::GetColumnName_abi_cxx11_((ColumnRefExpression *)&local_68);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)dependencies,__x);
    ColumnRefExpression::~ColumnRefExpression((ColumnRefExpression *)&local_68);
  }
  local_50 = ::std::
             _Function_handler<void_(duckdb::ParsedExpression_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/parser/column_definition.cpp:143:52)>
             ::_M_invoke;
  local_58 = ::std::
             _Function_handler<void_(duckdb::ParsedExpression_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/parser/column_definition.cpp:143:52)>
             ::_M_manager;
  local_68._M_unused._M_object = expr;
  local_68._8_8_ = dependencies;
  ParsedExpressionIterator::EnumerateChildren
            (expr,(function<void_(duckdb::ParsedExpression_&)> *)&local_68);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_68);
  return;
}

Assistant:

static void InnerGetListOfDependencies(ParsedExpression &expr, vector<string> &dependencies) {
	if (expr.GetExpressionType() == ExpressionType::COLUMN_REF) {
		auto columnref = expr.Cast<ColumnRefExpression>();
		auto &name = columnref.GetColumnName();
		dependencies.push_back(name);
	}
	ParsedExpressionIterator::EnumerateChildren(expr, [&](const ParsedExpression &child) {
		if (expr.GetExpressionType() == ExpressionType::LAMBDA) {
			throw NotImplementedException("Lambda functions are currently not supported in generated columns.");
		}
		InnerGetListOfDependencies((ParsedExpression &)child, dependencies);
	});
}